

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_1::BinaryWriterSpec::WriteConstVector(BinaryWriterSpec *this,ConstVector *consts)

{
  v128 *this_00;
  Const *this_01;
  Enum EVar1;
  pointer pCVar2;
  byte bVar3;
  unsigned_short uVar4;
  int iVar5;
  Type TVar6;
  uint uVar7;
  long lVar8;
  unsigned_long uVar9;
  ExpectedNan EVar10;
  long lVar11;
  ulong uVar12;
  undefined8 uVar13;
  char *pcVar14;
  Stream *pSVar15;
  ulong uVar16;
  Type local_4c;
  long local_48;
  ConstVector *local_40;
  ulong local_38;
  
  Stream::Writef(this->json_stream_,"[");
  local_48 = 0x38;
  uVar16 = 0;
  local_40 = consts;
  do {
    pCVar2 = (consts->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar8 = (long)(consts->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pCVar2;
    lVar11 = lVar8 % 0x48;
    if ((ulong)(lVar8 / 0x48) <= uVar16) {
      Stream::Writef(this->json_stream_,"]",lVar11);
      return;
    }
    this_01 = pCVar2 + uVar16;
    local_38 = uVar16;
    Stream::Writef(this->json_stream_,"{",lVar11);
    WriteKey(this,"type");
    EVar1 = pCVar2[uVar16].type_.enum_;
    switch(EVar1) {
    case Any:
    case ~I64:
switchD_0015fee9_caseD_0:
      abort();
    case Hostref:
      pcVar14 = "hostref";
LAB_00160125:
      WriteString(this,pcVar14);
      WriteSeparator(this);
      WriteKey(this,"value");
      uVar13 = *(undefined8 *)(this_01->data_).v;
      pSVar15 = this->json_stream_;
LAB_00160179:
      Stream::Writef(pSVar15,"\"%lu\"",uVar13);
      break;
    case V128:
      WriteString(this,"v128");
      WriteSeparator(this);
      WriteKey(this,"lane_type");
      local_4c = Const::lane_type(this_01);
      pcVar14 = Type::GetName(&local_4c);
      WriteString(this,pcVar14);
      WriteSeparator(this);
      WriteKey(this,"value");
      Stream::Writef(this->json_stream_,"[");
      lVar8 = local_48;
      this_00 = &this_01->data_;
      for (uVar16 = 0; iVar5 = Const::lane_count(this_01), (long)uVar16 < (long)iVar5;
          uVar16 = uVar16 + 1) {
        TVar6 = Const::lane_type(this_01);
        iVar5 = (int)uVar16;
        switch(TVar6.enum_) {
        case I16:
          pSVar15 = this->json_stream_;
          uVar4 = v128::To<unsigned_short>(this_00,iVar5);
          uVar12 = (ulong)uVar4;
          goto LAB_00160013;
        case I8:
          pSVar15 = this->json_stream_;
          bVar3 = v128::To<unsigned_char>(this_00,iVar5);
          uVar12 = (ulong)bVar3;
          goto LAB_00160013;
        default:
          goto switchD_0015fee9_caseD_0;
        case F64:
          uVar9 = v128::To<unsigned_long>(this_00,iVar5);
          EVar10 = None;
          if (uVar16 < 4) {
            EVar10 = *(ExpectedNan *)((pCVar2->data_).v + uVar16 * 4 + lVar8 + -0x28);
          }
          WriteF64(this,uVar9,EVar10);
          break;
        case F32:
          uVar7 = v128::To<unsigned_int>(this_00,iVar5);
          EVar10 = None;
          if (uVar16 < 4) {
            EVar10 = *(ExpectedNan *)((pCVar2->data_).v + uVar16 * 4 + lVar8 + -0x28);
          }
          WriteF32(this,uVar7,EVar10);
          break;
        case I64:
          pSVar15 = this->json_stream_;
          uVar9 = v128::To<unsigned_long>(this_00,iVar5);
          Stream::Writef(pSVar15,"\"%lu\"",uVar9);
          break;
        case I32:
          pSVar15 = this->json_stream_;
          uVar7 = v128::To<unsigned_int>(this_00,iVar5);
          uVar12 = (ulong)uVar7;
LAB_00160013:
          Stream::Writef(pSVar15,"\"%u\"",uVar12);
        }
        iVar5 = Const::lane_count(this_01);
        if (uVar16 != iVar5 - 1) {
          WriteSeparator(this);
        }
      }
      Stream::Writef(this->json_stream_,"]");
      consts = local_40;
      break;
    case F64:
      WriteString(this,"f64");
      WriteSeparator(this);
      WriteKey(this,"value");
      WriteF64(this,*(uint64_t *)(this_01->data_).v,this_01->nan_[0]);
      break;
    case F32:
      WriteString(this,"f32");
      WriteSeparator(this);
      WriteKey(this,"value");
      WriteF32(this,*(uint32_t *)(this_01->data_).v,this_01->nan_[0]);
      break;
    case I64:
      WriteString(this,"i64");
      WriteSeparator(this);
      WriteKey(this,"value");
      pSVar15 = this->json_stream_;
      uVar13 = *(undefined8 *)(this_01->data_).v;
      goto LAB_00160179;
    case I32:
      WriteString(this,"i32");
      WriteSeparator(this);
      WriteKey(this,"value");
      Stream::Writef(this->json_stream_,"\"%u\"",(ulong)*(uint *)(this_01->data_).v);
      break;
    default:
      if (EVar1 != Nullref) {
        if (EVar1 != Funcref) goto switchD_0015fee9_caseD_0;
        pcVar14 = "funcref";
        goto LAB_00160125;
      }
      WriteString(this,"nullref");
      WriteSeparator(this);
      WriteKey(this,"value");
      Stream::Writef(this->json_stream_,"\"0\"");
    }
    Stream::Writef(this->json_stream_,"}");
    uVar16 = local_38;
    if (local_38 !=
        ((long)(consts->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>)._M_impl.
               super__Vector_impl_data._M_finish -
        (long)(consts->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>)._M_impl.
              super__Vector_impl_data._M_start) / 0x48 - 1U) {
      WriteSeparator(this);
    }
    uVar16 = uVar16 + 1;
    local_48 = local_48 + 0x48;
  } while( true );
}

Assistant:

void BinaryWriterSpec::WriteConstVector(const ConstVector& consts) {
  json_stream_->Writef("[");
  for (size_t i = 0; i < consts.size(); ++i) {
    const Const& const_ = consts[i];
    WriteConst(const_);
    if (i != consts.size() - 1) {
      WriteSeparator();
    }
  }
  json_stream_->Writef("]");
}